

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
cs::method_namespace::preprocess
          (method_namespace *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  _func_int **pp_Var1;
  element_type *peVar2;
  const_reference pptVar3;
  token_base **pptVar4;
  string name;
  any local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pptVar3 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  local_40.mDat = (proxy *)(*pptVar3)[1]._vptr_token_base;
  pptVar4 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_40);
  pp_Var1 = (*pptVar4)[3]._vptr_token_base;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pp_Var1,(*pptVar4)[3].line_num + (long)pp_Var1);
  peVar2 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  cs_impl::any::any<std::__cxx11::string>(&local_40,&local_38);
  domain_manager::add_var_no_return<char_const(&)[35]>
            (&(peVar2->super_runtime_type).storage,
             (char (*) [35])"__PRAGMA_CS_NAMESPACE_DEFINITION__",&local_40);
  cs_impl::any::recycle(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void method_namespace::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::string name = static_cast<token_id *>(static_cast<token_expr *>(raw.front().at(
		                       1))->get_tree().root().data())->get_id();
		context->instance->storage.add_var_no_return("__PRAGMA_CS_NAMESPACE_DEFINITION__", name);
	}